

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::AddBaseTable
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::ColumnIndex,_true> *bound_column_ids,TableCatalogEntry *entry,
          bool add_virtual_columns)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_b8;
  idx_t index_local;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  TableCatalogEntry *local_70;
  virtual_column_map_t virtual_columns;
  
  virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_single_bucket;
  virtual_columns._M_h._M_bucket_count = 1;
  virtual_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  virtual_columns._M_h._M_element_count = 0;
  virtual_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  virtual_columns._M_h._M_rehash_policy._M_next_resize = 0;
  virtual_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  index_local = index;
  if (add_virtual_columns) {
    (*(entry->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x19])
              (&local_a8,entry);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign(&virtual_columns._M_h,&local_a8);
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a8);
  }
  local_70 = entry;
  make_uniq<duckdb::TableBinding,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::ColumnIndex,true>&,duckdb::TableCatalogEntry*,unsigned_long&,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
            ((duckdb *)&local_a8,alias,types,names,bound_column_ids,&local_70,&index_local,
             &virtual_columns);
  local_b8._M_head_impl = (Binding *)local_a8._M_buckets;
  local_a8._M_buckets = (__buckets_ptr)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_b8);
  if (local_b8._M_head_impl != (Binding *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_Binding[1])();
  }
  local_b8._M_head_impl = (Binding *)0x0;
  if (local_a8._M_buckets != (__buckets_ptr)0x0) {
    (*(code *)(*local_a8._M_buckets)[1]._M_nxt)();
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&virtual_columns._M_h);
  return;
}

Assistant:

void BindContext::AddBaseTable(idx_t index, const string &alias, const vector<string> &names,
                               const vector<LogicalType> &types, vector<ColumnIndex> &bound_column_ids,
                               TableCatalogEntry &entry, bool add_virtual_columns) {
	virtual_column_map_t virtual_columns;
	if (add_virtual_columns) {
		virtual_columns = entry.GetVirtualColumns();
	}
	AddBinding(
	    make_uniq<TableBinding>(alias, types, names, bound_column_ids, &entry, index, std::move(virtual_columns)));
}